

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[9],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [32],GlobalName *u,char (*args) [9],Newline *args_1)

{
  size_t size;
  
  size = strlen(*t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*t,size);
  anon_unknown_0::CWriter::Write((CWriter *)this,(GlobalName *)(ulong)u->type);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," = true;",8);
  if (*(int *)(this + 0x94) < 2) {
    anon_unknown_0::CWriter::WriteData((CWriter *)this,"\n",1);
    *(int *)(this + 0x94) = *(int *)(this + 0x94) + 1;
  }
  this[0x90] = (CWriter)0x1;
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }